

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

void flatbuffers::IterateObject(uint8_t *obj,TypeTable *type_table,IterationVisitor *visitor)

{
  TypeCode TVar1;
  voffset_t field;
  ElementaryType type_00;
  uint uVar2;
  size_t sVar3;
  bool bVar4;
  char *local_90;
  Vector<unsigned_char,_unsigned_int> *local_88;
  size_t j;
  Vector<unsigned_char,_unsigned_int> *vec;
  size_t size;
  uint8_t *elem_ptr;
  uint8_t *val;
  char *name;
  TypeTable *ref;
  short ref_idx;
  bool is_repeating;
  ElementaryType type;
  TypeCode type_code;
  size_t i;
  size_t array_idx;
  size_t set_idx;
  uint8_t *prev_val;
  IterationVisitor *visitor_local;
  TypeTable *type_table_local;
  uint8_t *obj_local;
  
  (**visitor->_vptr_IterationVisitor)();
  set_idx = 0;
  array_idx = 0;
  i = 0;
  for (_type = 0; _type < type_table->num_elems; _type = _type + 1) {
    TVar1 = type_table->type_codes[_type];
    type_00 = (ElementaryType)((ushort)TVar1 & 0xf);
    bVar4 = ((ushort)TVar1 >> 4 & 1) != 0;
    name = (char *)0x0;
    if (-1 < (short)TVar1 >> 5) {
      name = (char *)(*type_table->type_refs[(short)TVar1 >> 5])();
    }
    if (type_table->names == (char **)0x0) {
      local_90 = (char *)0x0;
    }
    else {
      local_90 = type_table->names[_type];
    }
    if (type_table->st == ST_TABLE) {
      field = FieldIndexToOffset((voffset_t)_type);
      elem_ptr = Table::GetAddressOf((Table *)obj,field);
    }
    else {
      elem_ptr = obj + type_table->values[_type];
    }
    (*visitor->_vptr_IterationVisitor[2])
              (visitor,_type,array_idx,(ulong)type_00,(ulong)bVar4,name,local_90,elem_ptr);
    if (elem_ptr != (uint8_t *)0x0) {
      array_idx = array_idx + 1;
      if (bVar4) {
        size = (size_t)elem_ptr;
        if (type_table->st == ST_TABLE) {
          uVar2 = ReadScalar<unsigned_int>(elem_ptr);
          elem_ptr = elem_ptr + uVar2;
          size = (size_t)Vector<unsigned_char,_unsigned_int>::Data
                                   ((Vector<unsigned_char,_unsigned_int> *)elem_ptr);
          uVar2 = Vector<unsigned_char,_unsigned_int>::size
                            ((Vector<unsigned_char,_unsigned_int> *)elem_ptr);
          vec = (Vector<unsigned_char,_unsigned_int> *)(ulong)uVar2;
        }
        else {
          vec = (Vector<unsigned_char,_unsigned_int> *)(long)type_table->array_sizes[i];
          i = i + 1;
        }
        (*visitor->_vptr_IterationVisitor[0x11])();
        for (local_88 = (Vector<unsigned_char,_unsigned_int> *)0x0; local_88 < vec;
            local_88 = local_88 + 1) {
          (*visitor->_vptr_IterationVisitor[0x13])(visitor,local_88,(ulong)type_00,name,size);
          IterateValue(type_00,(uint8_t *)size,(TypeTable *)name,(uint8_t *)set_idx,
                       (soffset_t)local_88,visitor);
          sVar3 = InlineSize(type_00,(TypeTable *)name);
          size = sVar3 + size;
        }
        (*visitor->_vptr_IterationVisitor[0x12])();
      }
      else {
        IterateValue(type_00,elem_ptr,(TypeTable *)name,(uint8_t *)set_idx,-1,visitor);
      }
    }
    set_idx = (size_t)elem_ptr;
  }
  (*visitor->_vptr_IterationVisitor[1])();
  return;
}

Assistant:

inline void IterateObject(const uint8_t *obj, const TypeTable *type_table,
                          IterationVisitor *visitor) {
  visitor->StartSequence();
  const uint8_t *prev_val = nullptr;
  size_t set_idx = 0;
  size_t array_idx = 0;
  for (size_t i = 0; i < type_table->num_elems; i++) {
    auto type_code = type_table->type_codes[i];
    auto type = static_cast<ElementaryType>(type_code.base_type);
    auto is_repeating = type_code.is_repeating != 0;
    auto ref_idx = type_code.sequence_ref;
    const TypeTable *ref = nullptr;
    if (ref_idx >= 0) { ref = type_table->type_refs[ref_idx](); }
    auto name = type_table->names ? type_table->names[i] : nullptr;
    const uint8_t *val = nullptr;
    if (type_table->st == ST_TABLE) {
      val = reinterpret_cast<const Table *>(obj)->GetAddressOf(
          FieldIndexToOffset(static_cast<voffset_t>(i)));
    } else {
      val = obj + type_table->values[i];
    }
    visitor->Field(i, set_idx, type, is_repeating, ref, name, val);
    if (val) {
      set_idx++;
      if (is_repeating) {
        auto elem_ptr = val;
        size_t size = 0;
        if (type_table->st == ST_TABLE) {
          // variable length vector
          val += ReadScalar<uoffset_t>(val);
          auto vec = reinterpret_cast<const Vector<uint8_t> *>(val);
          elem_ptr = vec->Data();
          size = vec->size();
        } else {
          // otherwise fixed size array
          size = type_table->array_sizes[array_idx];
          ++array_idx;
        }
        visitor->StartVector();
        for (size_t j = 0; j < size; j++) {
          visitor->Element(j, type, ref, elem_ptr);
          IterateValue(type, elem_ptr, ref, prev_val, static_cast<soffset_t>(j),
                       visitor);
          elem_ptr += InlineSize(type, ref);
        }
        visitor->EndVector();
      } else {
        IterateValue(type, val, ref, prev_val, -1, visitor);
      }
    }
    prev_val = val;
  }
  visitor->EndSequence();
}